

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

bool gl4cts::TextureViewUtilities::isLegalTextureTargetForTextureView
               (GLenum original_texture_target,GLenum view_texture_target)

{
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_11;
  bool result;
  GLenum view_texture_target_local;
  GLenum original_texture_target_local;
  
  local_11 = false;
  if (original_texture_target == 0xde0) {
    local_19 = view_texture_target == 0xde0 || view_texture_target == 0x8c18;
    local_11 = local_19;
  }
  else if (original_texture_target == 0xde1) {
    local_1a = view_texture_target == 0xde1 || view_texture_target == 0x8c1a;
    local_11 = local_1a;
  }
  else if (original_texture_target == 0x806f) {
    local_11 = view_texture_target == 0x806f;
  }
  else if (original_texture_target == 0x84f5) {
    local_11 = view_texture_target == 0x84f5;
  }
  else if (original_texture_target == 0x8513) {
    local_1b = true;
    if (((view_texture_target != 0x8513) && (local_1b = true, view_texture_target != 0xde1)) &&
       (local_1b = true, view_texture_target != 0x8c1a)) {
      local_1b = view_texture_target == 0x9009;
    }
    local_11 = local_1b;
  }
  else if (original_texture_target == 0x8c18) {
    local_1c = view_texture_target == 0x8c18 || view_texture_target == 0xde0;
    local_11 = local_1c;
  }
  else if (original_texture_target == 0x8c1a) {
    local_1d = true;
    if (((view_texture_target != 0x8c1a) && (local_1d = true, view_texture_target != 0xde1)) &&
       (local_1d = true, view_texture_target != 0x8513)) {
      local_1d = view_texture_target == 0x9009;
    }
    local_11 = local_1d;
  }
  else if (original_texture_target != 0x8c2a) {
    if (original_texture_target == 0x9009) {
      local_1e = true;
      if (((view_texture_target != 0x9009) && (local_1e = true, view_texture_target != 0x8c1a)) &&
         (local_1e = true, view_texture_target != 0xde1)) {
        local_1e = view_texture_target == 0x8513;
      }
      local_11 = local_1e;
    }
    else if (original_texture_target == 0x9100) {
      local_1f = view_texture_target == 0x9100 || view_texture_target == 0x9102;
      local_11 = local_1f;
    }
    else if (original_texture_target == 0x9102) {
      local_20 = view_texture_target == 0x9100 || view_texture_target == 0x9102;
      local_11 = local_20;
    }
  }
  return local_11;
}

Assistant:

bool TextureViewUtilities::isLegalTextureTargetForTextureView(glw::GLenum original_texture_target,
															  glw::GLenum view_texture_target)
{
	bool result = false;

	switch (original_texture_target)
	{
	case GL_TEXTURE_1D:
	{
		result = (view_texture_target == GL_TEXTURE_1D || view_texture_target == GL_TEXTURE_1D_ARRAY);

		break;
	}

	case GL_TEXTURE_2D:
	{
		result = (view_texture_target == GL_TEXTURE_2D || view_texture_target == GL_TEXTURE_2D_ARRAY);

		break;
	}

	case GL_TEXTURE_3D:
	{
		result = (view_texture_target == GL_TEXTURE_3D);

		break;
	}

	case GL_TEXTURE_CUBE_MAP:
	{
		result = (view_texture_target == GL_TEXTURE_CUBE_MAP || view_texture_target == GL_TEXTURE_2D ||
				  view_texture_target == GL_TEXTURE_2D_ARRAY || view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		break;
	}

	case GL_TEXTURE_RECTANGLE:
	{
		result = (view_texture_target == GL_TEXTURE_RECTANGLE);

		break;
	}

	case GL_TEXTURE_BUFFER:
	{
		/* No targets supported */

		break;
	}

	case GL_TEXTURE_1D_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_1D_ARRAY || view_texture_target == GL_TEXTURE_1D);

		break;
	}

	case GL_TEXTURE_2D_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_2D_ARRAY || view_texture_target == GL_TEXTURE_2D ||
				  view_texture_target == GL_TEXTURE_CUBE_MAP || view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		break;
	}

	case GL_TEXTURE_CUBE_MAP_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY || view_texture_target == GL_TEXTURE_2D_ARRAY ||
				  view_texture_target == GL_TEXTURE_2D || view_texture_target == GL_TEXTURE_CUBE_MAP);

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE:
	{
		result = (view_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  view_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	{
		result = (view_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  view_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

		break;
	}
	} /* switch (original_texture_target) */

	return result;
}